

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.cpp
# Opt level: O1

void CMU462::make_coord_space(Matrix3x3 *o2w,Vector3D *n)

{
  Vector3D *pVVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar4 = n->x;
  dVar6 = n->y;
  dVar7 = n->z;
  dVar2 = ABS(dVar4);
  dVar3 = ABS(dVar6);
  dVar10 = dVar6;
  dVar9 = dVar7;
  if ((dVar3 < dVar2) || (ABS(dVar7) < dVar2)) {
    dVar5 = dVar4;
    if ((dVar2 < dVar3) || (ABS(dVar7) < dVar3)) {
      dVar9 = 1.0;
    }
    else {
      dVar10 = 1.0;
    }
  }
  else {
    dVar5 = 1.0;
  }
  dVar3 = dVar7 * dVar7 + dVar4 * dVar4 + dVar6 * dVar6;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar3 = 1.0 / dVar3;
  dVar4 = dVar4 * dVar3;
  dVar6 = dVar6 * dVar3;
  dVar7 = dVar7 * dVar3;
  dVar2 = dVar10 * dVar7 - dVar6 * dVar9;
  dVar9 = dVar9 * dVar4 - dVar7 * dVar5;
  dVar10 = dVar5 * dVar6 - dVar4 * dVar10;
  dVar3 = dVar10 * dVar10 + dVar2 * dVar2 + dVar9 * dVar9;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar3 = 1.0 / dVar3;
  dVar2 = dVar2 * dVar3;
  dVar9 = dVar9 * dVar3;
  dVar3 = dVar3 * dVar10;
  dVar11 = dVar6 * dVar3 - dVar9 * dVar7;
  dVar8 = dVar7 * dVar2 - dVar3 * dVar4;
  dVar5 = dVar4 * dVar9 - dVar2 * dVar6;
  dVar10 = dVar5 * dVar5 + dVar11 * dVar11 + dVar8 * dVar8;
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  dVar10 = 1.0 / dVar10;
  pVVar1 = Matrix3x3::operator[](o2w,0);
  pVVar1->x = dVar11 * dVar10;
  pVVar1->y = dVar8 * dVar10;
  pVVar1->z = dVar10 * dVar5;
  pVVar1 = Matrix3x3::operator[](o2w,1);
  pVVar1->x = dVar2;
  pVVar1->y = dVar9;
  pVVar1->z = dVar3;
  pVVar1 = Matrix3x3::operator[](o2w,2);
  pVVar1->x = dVar4;
  pVVar1->y = dVar6;
  pVVar1->z = dVar7;
  return;
}

Assistant:

void make_coord_space(Matrix3x3& o2w, const Vector3D& n) {

    Vector3D z = Vector3D(n.x, n.y, n.z);
    Vector3D h = z;
    if (fabs(h.x) <= fabs(h.y) && fabs(h.x) <= fabs(h.z)) h.x = 1.0;
    else if (fabs(h.y) <= fabs(h.x) && fabs(h.y) <= fabs(h.z)) h.y = 1.0;
    else h.z = 1.0;

    z.normalize();
    Vector3D y = cross(h, z);
    y.normalize();
    Vector3D x = cross(z, y);
    x.normalize();

    o2w[0] = x;
    o2w[1] = y;
    o2w[2] = z;
  }